

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

pthread_t * start_thread(gpioThreadFunc_t *thread_func,void *arg)

{
  int iVar1;
  pthread_t *__newthread;
  char *__s;
  pthread_attr_t pthAttr;
  pthread_attr_t local_50;
  
  __newthread = (pthread_t *)malloc(8);
  if (__newthread != (pthread_t *)0x0) {
    iVar1 = pthread_attr_init(&local_50);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setstacksize(&local_50,0x40000);
      if (iVar1 == 0) {
        iVar1 = pthread_create(__newthread,&local_50,(__start_routine *)thread_func,arg);
        if (iVar1 == 0) {
          return __newthread;
        }
        __s = "pthread_create socket failed";
      }
      else {
        __s = "pthread_attr_setstacksize failed";
      }
    }
    else {
      __s = "pthread_attr_init failed";
    }
    perror(__s);
    free(__newthread);
  }
  return (pthread_t *)0x0;
}

Assistant:

pthread_t *start_thread(gpioThreadFunc_t thread_func, void *arg)
{
   pthread_t *pth;
   pthread_attr_t pthAttr;

   pth = malloc(sizeof(pthread_t));

   if (pth)
   {
      if (pthread_attr_init(&pthAttr))
      {
         perror("pthread_attr_init failed");
         free(pth);
         return NULL;
      }

      if (pthread_attr_setstacksize(&pthAttr, STACK_SIZE))
      {
         perror("pthread_attr_setstacksize failed");
         free(pth);
         return NULL;
      }

      if (pthread_create(pth, &pthAttr, thread_func, arg))
      {
         perror("pthread_create socket failed");
         free(pth);
         return NULL;
      }
   }
   return pth;
}